

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

void __thiscall
addrman_tests::addrman_select_by_network::test_method(addrman_select_by_network *this)

{
  long lVar1;
  initializer_list<Network> __l;
  initializer_list<Network> __l_00;
  initializer_list<Network> __l_01;
  initializer_list<Network> __l_02;
  initializer_list<Network> __l_03;
  initializer_list<Network> __l_04;
  initializer_list<Network> __l_05;
  initializer_list<Network> __l_06;
  initializer_list<Network> __l_07;
  initializer_list<Network> __l_08;
  initializer_list<Network> __l_09;
  initializer_list<Network> __l_10;
  initializer_list<Network> __l_11;
  initializer_list<Network> __l_12;
  initializer_list<Network> __l_13;
  initializer_list<Network> __l_14;
  initializer_list<Network> __l_15;
  initializer_list<Network> __l_16;
  initializer_list<Network> __l_17;
  initializer_list<Network> __l_18;
  initializer_list<Network> __l_19;
  initializer_list<CAddress> __l_20;
  initializer_list<CAddress> __l_21;
  initializer_list<CAddress> __l_22;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 *puVar5;
  long in_FS_OFFSET;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_stack_ffffffffffffdcc8;
  basic_cstring<const_char> *pbVar6;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *ppVar7;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *this_00;
  undefined7 in_stack_ffffffffffffdcd0;
  undefined1 in_stack_ffffffffffffdcd7;
  undefined7 in_stack_ffffffffffffdcd8;
  undefined1 in_stack_ffffffffffffdcdf;
  CService *in_stack_ffffffffffffdce0;
  NodeSeconds in_stack_ffffffffffffdce8;
  undefined7 in_stack_ffffffffffffdcf0;
  undefined1 in_stack_ffffffffffffdcf7;
  CAddress *in_stack_ffffffffffffdcf8;
  const_string *in_stack_ffffffffffffdd00;
  const_string *file;
  NodeContext *in_stack_ffffffffffffdd08;
  iterator in_stack_ffffffffffffdd10;
  string *in_stack_ffffffffffffdd18;
  string *in_stack_ffffffffffffdd20;
  uint16_t in_stack_ffffffffffffddb6;
  undefined1 *puVar8;
  undefined1 *local_1fb0;
  undefined1 *local_1dd8;
  int counter;
  bool tried_selected;
  bool new_selected;
  addrman_select_by_network *this_local;
  const_string local_1b50 [2];
  lazy_ostream local_1b30 [2];
  assertion_result local_1b10 [2];
  const_string local_1ad8 [2];
  lazy_ostream local_1ab8 [2];
  assertion_result local_1a98 [2];
  const_string local_1a60 [2];
  lazy_ostream local_1a40 [2];
  assertion_result local_1a20 [2];
  undefined1 local_19e3 [91];
  lazy_ostream local_1988 [2];
  basic_cstring<const_char> local_1963 [3];
  assertion_result local_1928 [2];
  const_string local_18f0 [2];
  lazy_ostream local_18d0 [4];
  assertion_result local_1890 [2];
  allocator<char> local_1851;
  const_string local_1850 [2];
  lazy_ostream local_1830 [2];
  basic_cstring<const_char> local_180b [3];
  assertion_result local_17d0 [2];
  const_string local_1798 [2];
  lazy_ostream local_1778 [2];
  basic_cstring<const_char> local_1753 [3];
  assertion_result local_1718 [2];
  const_string local_16e0 [2];
  lazy_ostream local_16c0 [2];
  assertion_result local_16a0 [2];
  const_string local_1668 [2];
  lazy_ostream local_1648 [2];
  assertion_result local_1628 [2];
  undefined1 local_15eb [3];
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  nets_without_entries;
  lazy_ostream local_1590 [2];
  basic_cstring<const_char> local_156b [3];
  assertion_result local_1530 [2];
  const_string local_14f8 [2];
  lazy_ostream local_14d8 [2];
  basic_cstring<const_char> local_14b3 [3];
  assertion_result local_1478 [2];
  const_string local_1440 [2];
  lazy_ostream local_1420 [2];
  basic_cstring<const_char> local_13fb [3];
  assertion_result local_13c0 [2];
  const_string local_1388 [2];
  lazy_ostream local_1368 [2];
  assertion_result local_1348 [2];
  undefined1 local_130b [3];
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  nets_with_entries;
  lazy_ostream local_12b0 [2];
  basic_cstring<const_char> local_128b [3];
  assertion_result local_1250 [2];
  const_string local_1218 [2];
  lazy_ostream local_11f8 [2];
  basic_cstring<const_char> local_11d3 [3];
  assertion_result local_1198 [2];
  const_string local_1160 [2];
  lazy_ostream local_1140 [2];
  basic_cstring<const_char> local_111b [3];
  assertion_result local_10e0 [2];
  const_string local_10a8 [2];
  lazy_ostream local_1088 [4];
  assertion_result local_1048 [2];
  allocator<char> local_1009;
  const_string local_1008 [2];
  lazy_ostream local_fe8 [2];
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  assertion_result local_f90 [2];
  const_string local_f58 [2];
  lazy_ostream local_f38 [2];
  basic_cstring<const_char> local_f13 [3];
  assertion_result local_ed8 [2];
  const_string local_ea0 [2];
  lazy_ostream local_e80 [2];
  basic_cstring<const_char> local_e5b [3];
  assertion_result local_e20 [2];
  const_string local_de8 [2];
  lazy_ostream local_dc8 [2];
  basic_cstring<const_char> local_da3 [3];
  assertion_result local_d68 [2];
  const_string local_d30 [2];
  lazy_ostream local_d10 [2];
  basic_cstring<const_char> local_ceb [3];
  assertion_result local_cb0 [2];
  const_string local_c78 [2];
  lazy_ostream local_c58 [2];
  basic_cstring<const_char> local_c33 [3];
  assertion_result local_bf8 [2];
  const_string local_bc0 [2];
  lazy_ostream local_ba0 [2];
  basic_cstring<const_char> local_b7b [3];
  assertion_result local_b40 [2];
  const_string local_b08 [2];
  lazy_ostream local_ae8 [2];
  basic_cstring<const_char> local_ac3 [3];
  assertion_result local_a88 [2];
  const_string local_a50 [2];
  lazy_ostream local_a30 [4];
  assertion_result local_9f0 [2];
  allocator<char> local_9b2;
  allocator<char> local_9b1;
  const_string local_9b0 [2];
  lazy_ostream local_990 [2];
  basic_cstring<const_char> local_96b [3];
  assertion_result local_930 [2];
  const_string local_8f8 [2];
  lazy_ostream local_8d8 [2];
  basic_cstring<const_char> local_8b3 [3];
  assertion_result local_878 [2];
  int32_t local_83c;
  __single_object addrman;
  CAddress selected;
  undefined1 local_728 [56];
  undefined1 local_6f0 [32];
  CAddress i2p_addr2;
  undefined1 local_400 [56];
  undefined1 local_3c8 [32];
  CAddress i2p_addr;
  undefined1 local_148 [56];
  undefined1 local_110 [32];
  CService addr1;
  CNetAddr source;
  
  local_1008[0].m_end = (iterator)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_83c = GetCheckRatio(in_stack_ffffffffffffdd08);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)in_stack_ffffffffffffdd00,(bool *)in_stack_ffffffffffffdcf8,
             (int *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    pbVar6 = local_8b3;
    std::allocator<Network>::allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    __l._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CNetAddr::IsValid(&in_stack_ffffffffffffdce0->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_878,local_8d8,local_8f8,199,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(in_stack_ffffffffffffdcc8);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffdcc8);
    std::allocator<Network>::~allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    pbVar6 = local_96b;
    std::allocator<Network>::allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    __l_00._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_00._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_00,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CNetAddr::IsValid(&in_stack_ffffffffffffdce0->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_930,local_990,local_9b0,200,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(in_stack_ffffffffffffdcc8);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffdcc8);
    std::allocator<Network>::~allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffdd18,(char *)in_stack_ffffffffffffdd10,
             (allocator<char> *)in_stack_ffffffffffffdd08);
  ResolveIP(in_stack_ffffffffffffdd20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdcc8);
  std::allocator<char>::~allocator(&local_9b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffdd18,(char *)in_stack_ffffffffffffdd10,
             (allocator<char> *)in_stack_ffffffffffffdd08);
  ResolveService(in_stack_ffffffffffffdd18,in_stack_ffffffffffffddb6);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdcc8);
  std::allocator<char>::~allocator(&local_9b2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    CService::CService((CService *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                       (CService *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CAddress::CAddress(in_stack_ffffffffffffdcf8,
                       (CService *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0),
                       (ServiceFlags)in_stack_ffffffffffffdce8.__d.__r);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffdcc8);
    __l_20._M_len = (size_type)in_stack_ffffffffffffdd18;
    __l_20._M_array = in_stack_ffffffffffffdd10;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffdd08,__l_20,
               (allocator_type *)in_stack_ffffffffffffdd00);
    s<(char)48>();
    AddrMan::Add((AddrMan *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                 (CNetAddr *)in_stack_ffffffffffffdcc8,in_stack_ffffffffffffdce8.__d.__r);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9f0,local_a30,local_a50,0xcd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8));
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffdcc8);
    local_1dd8 = local_110;
    do {
      local_1dd8 = local_1dd8 + -0x38;
      CAddress::~CAddress(&in_stack_ffffffffffffdcc8->first);
    } while (local_1dd8 != local_148);
    CService::~CService((CService *)in_stack_ffffffffffffdcc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    pbVar6 = local_ac3;
    std::allocator<Network>::allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    __l_01._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_01._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_01,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    ::operator==((CService *)in_stack_ffffffffffffdce8.__d.__r,in_stack_ffffffffffffdce0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a88,local_ae8,local_b08,0xcf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(in_stack_ffffffffffffdcc8);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffdcc8);
    std::allocator<Network>::~allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    pbVar6 = local_b7b;
    std::allocator<Network>::allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    __l_02._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_02._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_02,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    ::operator==((CService *)in_stack_ffffffffffffdce8.__d.__r,in_stack_ffffffffffffdce0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b40,local_ba0,local_bc0,0xd0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(in_stack_ffffffffffffdcc8);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffdcc8);
    std::allocator<Network>::~allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    pbVar6 = local_c33;
    std::allocator<Network>::allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    __l_03._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_03._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_03,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CNetAddr::IsValid(&in_stack_ffffffffffffdce0->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_bf8,local_c58,local_c78,0xd1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(in_stack_ffffffffffffdcc8);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffdcc8);
    std::allocator<Network>::~allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    pbVar6 = local_ceb;
    std::allocator<Network>::allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    __l_04._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_04._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_04,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CNetAddr::IsValid(&in_stack_ffffffffffffdce0->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_cb0,local_d10,local_d30,0xd2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(in_stack_ffffffffffffdcc8);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffdcc8);
    std::allocator<Network>::~allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    pbVar6 = local_da3;
    std::allocator<Network>::allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    __l_05._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_05._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_05,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CNetAddr::IsValid(&in_stack_ffffffffffffdce0->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d68,local_dc8,local_de8,0xd3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(in_stack_ffffffffffffdcc8);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffdcc8);
    std::allocator<Network>::~allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    pbVar6 = local_e5b;
    std::allocator<Network>::allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    __l_06._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_06._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_06,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CNetAddr::IsValid(&in_stack_ffffffffffffdce0->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e20,local_e80,local_ea0,0xd4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(in_stack_ffffffffffffdcc8);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffdcc8);
    std::allocator<Network>::~allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    pbVar6 = local_f13;
    std::allocator<Network>::allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    __l_07._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_07._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_07,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CNetAddr::IsValid(&in_stack_ffffffffffffdce0->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ed8,local_f38,local_f58,0xd5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(in_stack_ffffffffffffdcc8);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffdcc8);
    std::allocator<Network>::~allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    local_fa8 = 0;
    uStack_fa0 = 0;
    local_fb8 = 0;
    uStack_fb0 = 0;
    local_fc8 = 0;
    uStack_fc0 = 0;
    local_f98 = 0;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdcc8);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    ::operator==((CService *)in_stack_ffffffffffffdce8.__d.__r,in_stack_ffffffffffffdce0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f90,local_fe8,local_1008,0xd6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(in_stack_ffffffffffffdcc8);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffdcc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  CAddress::CAddress((CAddress *)in_stack_ffffffffffffdce8.__d.__r);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffdd18,(char *)in_stack_ffffffffffffdd10,
             (allocator<char> *)in_stack_ffffffffffffdd08);
  CNetAddr::SetSpecial
            ((CNetAddr *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0),
             (string *)in_stack_ffffffffffffdce8.__d.__r);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdcc8);
  std::allocator<char>::~allocator(&local_1009);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    CAddress::CAddress((CAddress *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                       (CAddress *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffdcc8);
    __l_21._M_len = (size_type)in_stack_ffffffffffffdd18;
    __l_21._M_array = in_stack_ffffffffffffdd10;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffdd08,__l_21,
               (allocator_type *)in_stack_ffffffffffffdd00);
    s<(char)48>();
    AddrMan::Add((AddrMan *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                 (CNetAddr *)in_stack_ffffffffffffdcc8,in_stack_ffffffffffffdce8.__d.__r);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1048,local_1088,local_10a8,0xdb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8));
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffdcc8);
    local_1fb0 = local_3c8;
    do {
      local_1fb0 = local_1fb0 + -0x38;
      CAddress::~CAddress(&in_stack_ffffffffffffdcc8->first);
    } while (local_1fb0 != local_400);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    pbVar6 = local_111b;
    std::allocator<Network>::allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    __l_08._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_08._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_08,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    ::operator==((CAddress *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                 (CAddress *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_10e0,local_1140,local_1160,0xdd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(in_stack_ffffffffffffdcc8);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffdcc8);
    std::allocator<Network>::~allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    pbVar6 = local_11d3;
    std::allocator<Network>::allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    __l_09._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_09._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_09,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    ::operator==((CAddress *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                 (CAddress *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1198,local_11f8,local_1218,0xde,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(in_stack_ffffffffffffdcc8);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffdcc8);
    std::allocator<Network>::~allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)in_stack_ffffffffffffdcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffdcc8);
    pbVar6 = local_128b;
    std::allocator<Network>::allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    __l_10._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_10._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_10,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    ::operator==((CService *)in_stack_ffffffffffffdce8.__d.__r,in_stack_ffffffffffffdce0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    in_stack_ffffffffffffdcc8 =
         (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1250,local_12b0,(const_string *)&stack0xffffffffffffed30,0xdf,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdcc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdcc8);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(in_stack_ffffffffffffdcc8);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_ffffffffffffdcc8);
    std::allocator<Network>::~allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  ppVar7 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)local_130b;
  std::allocator<Network>::allocator((allocator<Network> *)in_stack_ffffffffffffdcc8);
  __l_11._M_len = (size_type)in_stack_ffffffffffffdd08;
  __l_11._M_array = (iterator)in_stack_ffffffffffffdd00;
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_11,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
  std::allocator<Network>::~allocator((allocator<Network> *)ppVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)ppVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)ppVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)ppVar7);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CNetAddr::IsValid(&in_stack_ffffffffffffdce0->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)ppVar7);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (basic_cstring<const_char> *)ppVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)ppVar7);
    ppVar7 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1348,local_1368,local_1388,0xe1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)ppVar7);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)ppVar7);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(ppVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)ppVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)ppVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)ppVar7);
    pbVar6 = local_13fb;
    std::allocator<Network>::allocator((allocator<Network> *)ppVar7);
    __l_12._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_12._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_12,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CNetAddr::IsValid(&in_stack_ffffffffffffdce0->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    ppVar7 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_13c0,local_1420,local_1440,0xe2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)ppVar7);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)ppVar7);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(ppVar7);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)ppVar7);
    std::allocator<Network>::~allocator((allocator<Network> *)ppVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)ppVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)ppVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)ppVar7);
    pbVar6 = local_14b3;
    std::allocator<Network>::allocator((allocator<Network> *)ppVar7);
    __l_13._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_13._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_13,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CNetAddr::IsValid(&in_stack_ffffffffffffdce0->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    ppVar7 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1478,local_14d8,local_14f8,0xe3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)ppVar7);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)ppVar7);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(ppVar7);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)ppVar7);
    std::allocator<Network>::~allocator((allocator<Network> *)ppVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)ppVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)ppVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)ppVar7);
    pbVar6 = local_156b;
    std::allocator<Network>::allocator((allocator<Network> *)ppVar7);
    __l_14._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_14._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_14,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CNetAddr::IsValid(&in_stack_ffffffffffffdce0->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    ppVar7 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1530,local_1590,(const_string *)&stack0xffffffffffffea50,0xe4,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)ppVar7);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)ppVar7);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(ppVar7);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)ppVar7);
    std::allocator<Network>::~allocator((allocator<Network> *)ppVar7);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  this_00 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)local_15eb;
  std::allocator<Network>::allocator((allocator<Network> *)ppVar7);
  __l_15._M_len = (size_type)in_stack_ffffffffffffdd08;
  __l_15._M_array = (iterator)in_stack_ffffffffffffdd00;
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_15,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
  std::allocator<Network>::~allocator((allocator<Network> *)this_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)this_00);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CNetAddr::IsValid(&in_stack_ffffffffffffdce0->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    this_00 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1628,local_1648,local_1668,0xe6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(this_00);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)this_00);
    Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    AddrMan::Good((AddrMan *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (CService *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  in_stack_ffffffffffffdce8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    this_00 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_16a0,local_16c0,local_16e0,0xe9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)this_00);
    pbVar6 = local_1753;
    std::allocator<Network>::allocator((allocator<Network> *)this_00);
    __l_16._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_16._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_16,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CNetAddr::IsValid(&in_stack_ffffffffffffdce0->super_CNetAddr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    this_00 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1718,local_1778,local_1798,0xeb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(this_00);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)this_00);
    std::allocator<Network>::~allocator((allocator<Network> *)this_00);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)this_00);
    pbVar6 = local_180b;
    std::allocator<Network>::allocator((allocator<Network> *)this_00);
    __l_17._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_17._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_17,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    ::operator==((CAddress *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                 (CAddress *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    this_00 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_17d0,local_1830,local_1850,0xec,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(this_00);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)this_00);
    std::allocator<Network>::~allocator((allocator<Network> *)this_00);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  CAddress::CAddress((CAddress *)in_stack_ffffffffffffdce8.__d.__r);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffdd18,(char *)in_stack_ffffffffffffdd10,
             (allocator<char> *)in_stack_ffffffffffffdd08);
  CNetAddr::SetSpecial
            ((CNetAddr *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0),
             (string *)in_stack_ffffffffffffdce8.__d.__r);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_1851);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)this_00);
    CAddress::CAddress((CAddress *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                       (CAddress *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    std::allocator<CAddress>::allocator((allocator<CAddress> *)this_00);
    __l_22._M_len = (size_type)in_stack_ffffffffffffdd18;
    __l_22._M_array = in_stack_ffffffffffffdd10;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffdd08,__l_22,
               (allocator_type *)in_stack_ffffffffffffdd00);
    s<(char)48>();
    AddrMan::Add((AddrMan *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),(CNetAddr *)this_00,
                 in_stack_ffffffffffffdce8.__d.__r);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    this_00 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1890,local_18d0,local_18f0,0xf1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8));
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)this_00);
    puVar8 = local_728;
    puVar5 = local_6f0;
    do {
      puVar5 = puVar5 + -0x38;
      CAddress::~CAddress(&this_00->first);
    } while (puVar5 != puVar8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
               (size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)this_00);
    pbVar6 = local_1963;
    std::allocator<Network>::allocator((allocator<Network> *)this_00);
    __l_18._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_18._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_18,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    ::operator==((CAddress *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                 (CAddress *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),pbVar6)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)pbVar6);
    this_00 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1928,local_1988,(const_string *)(local_19e3 + 0x3b),0xf3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(this_00);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)this_00);
    std::allocator<Network>::~allocator((allocator<Network> *)this_00);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  bVar3 = false;
  bVar2 = 0;
  counter = 0x100;
  while( true ) {
    counter = counter + -1;
    bVar4 = false;
    if ((0 < counter) && (bVar4 = true, bVar3)) {
      bVar4 = (bool)(bVar2 ^ 1);
    }
    if (!bVar4) break;
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)this_00);
    ppVar7 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)local_19e3;
    std::allocator<Network>::allocator((allocator<Network> *)this_00);
    __l_19._M_len = (size_type)in_stack_ffffffffffffdd08;
    __l_19._M_array = (iterator)in_stack_ffffffffffffdd00;
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_ffffffffffffdce8.__d.__r,__l_19,(size_type)in_stack_ffffffffffffdce0,
                  (hasher *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                  (key_equal *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                  (allocator_type *)in_stack_ffffffffffffdd20);
    AddrMan::Select((AddrMan *)in_stack_ffffffffffffdce0,(bool)in_stack_ffffffffffffdcdf,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    CAddress::CAddress((CAddress *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                       (CAddress *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~pair(ppVar7);
    std::
    unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
    ~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)ppVar7);
    std::allocator<Network>::~allocator((allocator<Network> *)ppVar7);
    this_00 = ppVar7;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                 (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                 (unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
                 (size_t)in_stack_ffffffffffffdcf8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
      bVar4 = ::operator==((CAddress *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8)
                           ,(CAddress *)
                            CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
      if (!bVar4) {
        ::operator==((CAddress *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                     (CAddress *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
      }
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                 (bool)in_stack_ffffffffffffdcd7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                 (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                 (unsigned_long)this_00);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                 (basic_cstring<const_char> *)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                 (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
                 (unsigned_long)this_00);
      this_00 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                 *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1a20,local_1a40,local_1a60,0xfc,REQUIRE,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)this_00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
      bVar4 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar4);
    bVar4 = ::operator==((CAddress *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
                         (CAddress *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0));
    if (bVar4) {
      bVar2 = 1;
    }
    else {
      bVar3 = true;
    }
    CAddress::~CAddress(&this_00->first);
  }
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,file,(size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    in_stack_ffffffffffffdcf8 = (CAddress *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    this_00 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1a98,local_1ab8,local_1ad8,0x104,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    in_stack_ffffffffffffdcf7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffdcf7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdd08,file,(size_t)in_stack_ffffffffffffdcf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffdcf7,in_stack_ffffffffffffdcf0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (bool)in_stack_ffffffffffffdcd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdcd7,in_stack_ffffffffffffdcd0),
               (unsigned_long)this_00);
    this_00 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1b10,local_1b30,local_1b50,0x105,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    in_stack_ffffffffffffdcdf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffdcdf);
  CAddress::~CAddress(&this_00->first);
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)this_00);
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)this_00);
  CAddress::~CAddress(&this_00->first);
  CService::~CService((CService *)this_00);
  CNetAddr::~CNetAddr((CNetAddr *)this_00);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)
             CONCAT17(in_stack_ffffffffffffdcdf,in_stack_ffffffffffffdcd8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_select_by_network)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    BOOST_CHECK(!addrman->Select(/*new_only=*/true, {NET_IPV4}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_IPV4}).first.IsValid());

    // add ipv4 address to the new table
    CNetAddr source = ResolveIP("252.2.2.2");
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));

    BOOST_CHECK(addrman->Select(/*new_only=*/true, {NET_IPV4}).first == addr1);
    BOOST_CHECK(addrman->Select(/*new_only=*/false, {NET_IPV4}).first == addr1);
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_IPV6}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_ONION}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_I2P}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_CJDNS}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/true, {NET_CJDNS}).first.IsValid());
    BOOST_CHECK(addrman->Select(/*new_only=*/false).first == addr1);

    // add I2P address to the new table
    CAddress i2p_addr;
    i2p_addr.SetSpecial("udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.i2p");
    BOOST_CHECK(addrman->Add({i2p_addr}, source));

    BOOST_CHECK(addrman->Select(/*new_only=*/true, {NET_I2P}).first == i2p_addr);
    BOOST_CHECK(addrman->Select(/*new_only=*/false, {NET_I2P}).first == i2p_addr);
    BOOST_CHECK(addrman->Select(/*new_only=*/false, {NET_IPV4}).first == addr1);
    std::unordered_set<Network> nets_with_entries = {NET_IPV4, NET_I2P};
    BOOST_CHECK(addrman->Select(/*new_only=*/false, nets_with_entries).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_IPV6}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_ONION}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_CJDNS}).first.IsValid());
    std::unordered_set<Network> nets_without_entries = {NET_IPV6, NET_ONION, NET_CJDNS};
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, nets_without_entries).first.IsValid());

    // bump I2P address to tried table
    BOOST_CHECK(addrman->Good(i2p_addr));

    BOOST_CHECK(!addrman->Select(/*new_only=*/true, {NET_I2P}).first.IsValid());
    BOOST_CHECK(addrman->Select(/*new_only=*/false, {NET_I2P}).first == i2p_addr);

    // add another I2P address to the new table
    CAddress i2p_addr2;
    i2p_addr2.SetSpecial("c4gfnttsuwqomiygupdqqqyy5y5emnk5c73hrfvatri67prd7vyq.b32.i2p");
    BOOST_CHECK(addrman->Add({i2p_addr2}, source));

    BOOST_CHECK(addrman->Select(/*new_only=*/true, {NET_I2P}).first == i2p_addr2);

    // ensure that both new and tried table are selected from
    bool new_selected{false};
    bool tried_selected{false};
    int counter = 256;

    while (--counter > 0 && (!new_selected || !tried_selected)) {
        const CAddress selected{addrman->Select(/*new_only=*/false, {NET_I2P}).first};
        BOOST_REQUIRE(selected == i2p_addr || selected == i2p_addr2);
        if (selected == i2p_addr) {
            tried_selected = true;
        } else {
            new_selected = true;
        }
    }

    BOOST_CHECK(new_selected);
    BOOST_CHECK(tried_selected);
}